

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  MessageOptions *this_00;
  anon_union_216_1_493b367e_for_DescriptorProto_4 aVar1;
  undefined8 *puVar2;
  LogMessageFatal aLStack_18 [16];
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            (&(this->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
            (&(this->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
            (&(this->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
            (&(this->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            (&(this->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
            (&(this->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
            (&(this->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [216])aVar1 & (undefined1  [216])0x3) != (undefined1  [216])0x0) {
    if (((undefined1  [216])aVar1 & (undefined1  [216])0x1) != (undefined1  [216])0x0) {
      puVar2 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if (((undefined1  [216])aVar1 & (undefined1  [216])0x2) != (undefined1  [216])0x0) {
      this_00 = (this->field_0)._impl_.options_;
      if (this_00 == (MessageOptions *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
                   ,0x1140,0x1a,"_impl_.options_ != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
      }
      MessageOptions::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.field_.Clear();
  _impl_.nested_type_.Clear();
  _impl_.enum_type_.Clear();
  _impl_.extension_range_.Clear();
  _impl_.extension_.Clear();
  _impl_.oneof_decl_.Clear();
  _impl_.reserved_range_.Clear();
  _impl_.reserved_name_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}